

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAPI.cpp
# Opt level: O2

void __thiscall
glcts::GeometryShaderInsufficientEmittedVerticesTest::GeometryShaderInsufficientEmittedVerticesTest
          (GeometryShaderInsufficientEmittedVerticesTest *this,Context *context,
          ExtParameters *extParams,char *name,char *description)

{
  GLubyte *pGVar1;
  
  TestCaseBase::TestCaseBase(&this->super_TestCaseBase,context,extParams,name,description);
  (this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCaseBase_01df7140;
  this->m_fbo_id = 0;
  this->m_fs_id = 0;
  this->m_gs_ids = (GLuint *)0x0;
  this->m_number_of_color_components = 4;
  this->m_number_of_gs = 2;
  this->m_po_ids = (GLuint *)0x0;
  this->m_vao_id = 0;
  this->m_texture_height = 0x10;
  this->m_texture_id = 0;
  this->m_texture_width = 0x10;
  this->m_vs_id = 0;
  pGVar1 = (GLubyte *)operator_new__(0x400);
  this->m_pixels = pGVar1;
  return;
}

Assistant:

GeometryShaderInsufficientEmittedVerticesTest::GeometryShaderInsufficientEmittedVerticesTest(
	Context& context, const ExtParameters& extParams, const char* name, const char* description)
	: TestCaseBase(context, extParams, name, description)
	, m_fbo_id(0)
	, m_fs_id(0)
	, m_gs_ids(NULL)
	, m_number_of_color_components(4)
	, m_number_of_gs(2 /*taken from test spec*/)
	, m_po_ids(NULL)
	, m_texture_height(16)
	, m_texture_id(0)
	, m_texture_width(16)
{
	m_vao_id = 0;
	m_vs_id  = 0;

	/* Allocate enough memory for glReadPixels() data which is respectively: width, height, RGBA components number. */
	m_pixels = new glw::GLubyte[m_texture_height * m_texture_width * m_number_of_color_components];
}